

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void signal_handler(int signo)

{
  _Any_data *p_Var1;
  key_type local_4;
  
  p_Var1 = (_Any_data *)
           std::__detail::
           _Map_base<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&functors,&local_4);
  if (*(long *)(p_Var1 + 1) != 0) {
    (**(code **)(p_Var1->_M_pod_data + 0x18))(p_Var1);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

static void signal_handler(int signo) { functors[signo](); }